

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_smart_pointers.cpp
# Opt level: O0

void use_shared_pointer(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  element_type *peVar3;
  ostream *poVar4;
  shared_ptr<std::__cxx11::string> *local_148;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pwin;
  allocator local_6f;
  undefined1 local_6e;
  allocator local_6d [13];
  shared_ptr<std::__cxx11::string> *local_60;
  shared_ptr<std::__cxx11::string> local_58 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  films [5];
  
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._1_1_ = 1;
  local_60 = local_58;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  local_6e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)pbVar2,"The Iron Man",local_6d);
  local_6e = 0;
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>(local_58,pbVar2);
  p_Var1 = &films[0].
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_60 = (shared_ptr<std::__cxx11::string> *)p_Var1;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)pbVar2,"The amazing four",&local_6f);
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string> *)p_Var1,pbVar2);
  p_Var1 = &films[1].
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_60 = (shared_ptr<std::__cxx11::string> *)p_Var1;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)pbVar2,"Capital America",
             (allocator *)
             ((long)&pwin.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._6_1_ = 0;
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string> *)p_Var1,pbVar2);
  p_Var1 = &films[2].
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_60 = (shared_ptr<std::__cxx11::string> *)p_Var1;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)pbVar2,"The spiderman",
             (allocator *)
             ((long)&pwin.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 5));
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_1_ = 0;
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string> *)p_Var1,pbVar2);
  p_Var1 = &films[3].
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_60 = (shared_ptr<std::__cxx11::string> *)p_Var1;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._2_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)pbVar2,"The superman",
             (allocator *)
             ((long)&pwin.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._2_1_ = 0;
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string> *)p_Var1,pbVar2);
  pwin.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._1_1_ = 0;
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pwin.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pwin.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pwin.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_6f);
  std::allocator<char>::~allocator((allocator<char> *)local_6d);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_88);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_88,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&films[1].
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
  std::operator<<((ostream *)&std::cout,"The mavel movies are:\n");
  for (local_8c = 0; local_8c < 5; local_8c = local_8c + 1) {
    peVar3 = std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&films[(long)local_8c + -1].
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)peVar3);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"The winner is ");
  peVar3 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_88);
  poVar4 = std::operator<<(poVar4,(string *)peVar3);
  std::operator<<(poVar4,"!\n");
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_88);
  local_148 = (shared_ptr<std::__cxx11::string> *)
              &films[4].
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  do {
    local_148 = local_148 + -0x10;
    std::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_148);
  } while (local_148 != local_58);
  return;
}

Assistant:

void use_shared_pointer() {
    using namespace std;

    shared_ptr<string> films[5] = {
            shared_ptr<string>(new string("The Iron Man")),
            shared_ptr<string>(new string("The amazing four")),
            shared_ptr<string>(new string("Capital America")),
            shared_ptr<string>(new string("The spiderman")),
            shared_ptr<string>(new string("The superman")),
    };

    shared_ptr<string> pwin;
    //  point to same string, reference count ++
    pwin = films[2];

    std::cout << "The mavel movies are:\n";
    for (int i = 0; i < 5; i++) {
        std::cout << *films[i] << std::endl;
    }
    std::cout << "The winner is " << *pwin << "!\n";
//    cin.get();
}